

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_Utils.h
# Opt level: O2

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::fixupL
          (SparseLUImpl<double,_int> *this,int n,IndexVector *perm_r,GlobalLU_t *glu)

{
  Matrix<int,__1,_1,_0,__1,_1> *this_00;
  int iVar1;
  Scalar *pSVar2;
  CoeffReturnType piVar3;
  long lVar4;
  long index;
  int iVar5;
  long index_00;
  long index_01;
  
  pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno,(long)n
                     );
  iVar1 = *pSVar2;
  this_00 = &glu->xlsub;
  index = 0;
  index_00 = 0;
  while (iVar5 = (int)index_00, index <= iVar1) {
    pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)glu,index);
    lVar4 = (long)*pSVar2;
    pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_00,lVar4);
    index_01 = (long)*pSVar2;
    pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_00,lVar4);
    *pSVar2 = iVar5;
    lVar4 = lVar4 + 1;
    index_00 = (long)iVar5;
    while( true ) {
      pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_00,lVar4);
      if (*pSVar2 <= index_01) break;
      pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->lsub,
                          index_01);
      piVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)perm_r,
                          (long)*pSVar2);
      iVar5 = *piVar3;
      pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->lsub,
                          index_00);
      *pSVar2 = iVar5;
      index_00 = index_00 + 1;
      index_01 = index_01 + 1;
    }
    index = index + 1;
    while( true ) {
      pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)glu,index);
      if (*pSVar2 <= lVar4) break;
      pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_00,lVar4);
      *pSVar2 = (Scalar)index_00;
      lVar4 = lVar4 + 1;
    }
  }
  pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)this_00,(long)n);
  *pSVar2 = iVar5;
  return;
}

Assistant:

void SparseLUImpl<Scalar,Index>::fixupL(const Index n, const IndexVector& perm_r, GlobalLU_t& glu)
{
  Index fsupc, i, j, k, jstart; 
  
  Index nextl = 0; 
  Index nsuper = (glu.supno)(n); 
  
  // For each supernode 
  for (i = 0; i <= nsuper; i++)
  {
    fsupc = glu.xsup(i); 
    jstart = glu.xlsub(fsupc); 
    glu.xlsub(fsupc) = nextl; 
    for (j = jstart; j < glu.xlsub(fsupc + 1); j++)
    {
      glu.lsub(nextl) = perm_r(glu.lsub(j)); // Now indexed into P*A
      nextl++;
    }
    for (k = fsupc+1; k < glu.xsup(i+1); k++)
      glu.xlsub(k) = nextl; // other columns in supernode i
  }
  
  glu.xlsub(n) = nextl; 
}